

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<capnp::AnyPointer::Pipeline> * __thiscall
kj::_::ExceptionOr<capnp::AnyPointer::Pipeline>::operator=
          (ExceptionOr<capnp::AnyPointer::Pipeline> *this,
          ExceptionOr<capnp::AnyPointer::Pipeline> *param_1)

{
  ExceptionOr<capnp::AnyPointer::Pipeline> *param_1_local;
  ExceptionOr<capnp::AnyPointer::Pipeline> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<capnp::AnyPointer::Pipeline>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;